

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cygwin.cpp
# Opt level: O0

string * fs_convert_path_abi_cxx11_(string *__return_storage_ptr__,string_view path,int what)

{
  string_view path_00;
  string_view local_48;
  size_t local_38;
  char *local_30;
  int local_24;
  size_t sStack_20;
  int what_local;
  string_view path_local;
  
  local_30 = path._M_str;
  local_38 = path._M_len;
  local_24 = what;
  sStack_20 = local_38;
  path_local._M_len = (size_t)local_30;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"fs_convert_path");
  path_00._M_str = local_30;
  path_00._M_len = local_38;
  fs_print_error(path_00,local_48);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string fs_convert_path(std::string_view path, FFS_MAYBE_UNUSED int const what)
{
#ifdef __CYGWIN__
  const auto L = cygwin_conv_path(what, path.data(), nullptr, 0);
  if(L > 0){
    if (std::string r(L, '\0'); !cygwin_conv_path(what, path.data(), r.data(), L))
      return r;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}